

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Snes_Spc.cpp
# Opt level: O2

void __thiscall Snes_Spc::timers_loaded(Snes_Spc *this)

{
  byte bVar1;
  int *piVar2;
  long lVar3;
  
  bVar1 = (this->m).smp_regs[0][1];
  piVar2 = &(this->m).timers[0].counter;
  for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
    piVar2[-3] = (byte)((this->m).smp_regs[0][lVar3 + 10] - 1) + 1;
    piVar2[-1] = (uint)((bVar1 >> ((uint)lVar3 & 0x1f) & 1) != 0);
    *piVar2 = (this->m).smp_regs[1][lVar3 + 0xd] & 0xf;
    piVar2 = piVar2 + 6;
  }
  set_tempo(this,(this->m).tempo);
  return;
}

Assistant:

void Snes_Spc::timers_loaded()
{
	int i;
	for ( i = 0; i < timer_count; i++ )
	{
		Timer* t = &m.timers [i];
		t->period  = IF_0_THEN_256( REGS [r_t0target + i] );
		t->enabled = REGS [r_control] >> i & 1;
		t->counter = REGS_IN [r_t0out + i] & 0x0F;
	}
	
	set_tempo( m.tempo );
}